

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

mz_bool mz_zip_writer_finalize_heap_archive(mz_zip_archive *pZip,void **ppBuf,size_t *pSize)

{
  mz_zip_internal_state *pmVar1;
  mz_bool mVar2;
  
  if (ppBuf != (void **)0x0 && pSize != (size_t *)0x0) {
    *ppBuf = (void *)0x0;
    *pSize = 0;
    if (pZip == (mz_zip_archive *)0x0) {
      return 0;
    }
    if (pZip->m_pState != (mz_zip_internal_state *)0x0) {
      if (pZip->m_pWrite == mz_zip_heap_write_func) {
        mVar2 = mz_zip_writer_finalize_archive(pZip);
        if (mVar2 == 0) {
          return 0;
        }
        *ppBuf = pZip->m_pState->m_pMem;
        pmVar1 = pZip->m_pState;
        *pSize = pmVar1->m_mem_size;
        pmVar1->m_pMem = (void *)0x0;
        pmVar1->m_mem_size = 0;
        pmVar1->m_mem_capacity = 0;
        return 1;
      }
      goto LAB_00129d59;
    }
  }
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
LAB_00129d59:
  pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
  return 0;
}

Assistant:

mz_bool mz_zip_writer_finalize_heap_archive(mz_zip_archive *pZip, void **ppBuf, size_t *pSize)
{
    if ((!ppBuf) || (!pSize))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    *ppBuf = NULL;
    *pSize = 0;

    if ((!pZip) || (!pZip->m_pState))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (pZip->m_pWrite != mz_zip_heap_write_func)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_writer_finalize_archive(pZip))
        return MZ_FALSE;

    *ppBuf = pZip->m_pState->m_pMem;
    *pSize = pZip->m_pState->m_mem_size;
    pZip->m_pState->m_pMem = NULL;
    pZip->m_pState->m_mem_size = pZip->m_pState->m_mem_capacity = 0;

    return MZ_TRUE;
}